

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

CURLcode Curl_hsts_save(Curl_easy *data,hsts *h,char *file)

{
  void *pvVar1;
  FILE *whereto;
  CURLcode CVar2;
  int iVar3;
  CURLSTScode CVar4;
  char *pcVar5;
  Curl_llist_element *unaff_R12;
  Curl_llist_element *pCVar6;
  char *tempstore;
  FILE *out;
  hsts *local_b0;
  ulong local_a8;
  curl_index i;
  tm local_90;
  curl_hstsentry e;
  
  tempstore = (char *)0x0;
  if (h == (hsts *)0x0) {
    CVar2 = CURLE_OK;
  }
  else {
    if (file == (char *)0x0) {
      file = h->filename;
    }
    CVar2 = CURLE_OK;
    if (((file != (char *)0x0) && (CVar2 = CURLE_OK, (h->flags & 2) == 0)) && (*file != '\0')) {
      CVar2 = Curl_fopen(data,file,&out,&tempstore);
      if (CVar2 == CURLE_OK) {
        fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)out);
        unaff_R12 = (h->list).head;
        local_b0 = h;
        if (unaff_R12 == (Curl_llist_element *)0x0) {
          CVar2 = CURLE_OK;
          unaff_R12 = (Curl_llist_element *)0x0;
        }
        else {
          do {
            whereto = out;
            pvVar1 = unaff_R12->ptr;
            unaff_R12 = unaff_R12->next;
            if (*(long *)((long)pvVar1 + 0x28) == 0x7fffffffffffffff) {
              pcVar5 = "";
              if (*(char *)((long)pvVar1 + 0x20) != '\0') {
                pcVar5 = ".";
              }
              CVar2 = CURLE_OK;
              curl_mfprintf(out,"%s%s \"%s\"\n",pcVar5,*(undefined8 *)((long)pvVar1 + 0x18),
                            "unlimited");
            }
            else {
              CVar2 = Curl_gmtime(*(long *)((long)pvVar1 + 0x28),&local_90);
              if (CVar2 == CURLE_OK) {
                pcVar5 = "";
                if (*(char *)((long)pvVar1 + 0x20) != '\0') {
                  pcVar5 = ".";
                }
                local_a8 = (ulong)(uint)local_90.tm_mday;
                CVar2 = CURLE_OK;
                curl_mfprintf(whereto,"%s%s \"%d%02d%02d %02d:%02d:%02d\"\n",pcVar5,
                              *(undefined8 *)((long)pvVar1 + 0x18),(ulong)(local_90.tm_year + 0x76c)
                              ,(ulong)(local_90.tm_mon + 1),local_a8,(ulong)(uint)local_90.tm_hour,
                              (ulong)(uint)local_90.tm_min,(ulong)(uint)local_90.tm_sec);
              }
            }
          } while ((CVar2 == CURLE_OK) && (unaff_R12 != (Curl_llist_element *)0x0));
        }
        fclose((FILE *)out);
        if (tempstore != (char *)0x0 && CVar2 == CURLE_OK) {
          iVar3 = Curl_rename(tempstore,file);
          CVar2 = CURLE_WRITE_ERROR;
          if (iVar3 == 0) {
            CVar2 = CURLE_OK;
          }
        }
        h = local_b0;
        if (tempstore != (char *)0x0 && CVar2 != CURLE_OK) {
          unlink(tempstore);
        }
      }
      (*Curl_cfree)(tempstore);
    }
    if ((data->set).hsts_write != (curl_hstswrite_callback)0x0) {
      i.total = (h->list).size;
      i.index = 0;
      pCVar6 = (h->list).head;
      if (pCVar6 != (Curl_llist_element *)0x0) {
        do {
          pvVar1 = pCVar6->ptr;
          pCVar6 = pCVar6->next;
          e.name = *(char **)((long)pvVar1 + 0x18);
          e.namelen = strlen(e.name);
          e._16_1_ = e._16_1_ & 0xfe | *(byte *)((long)pvVar1 + 0x20);
          if (*(long *)((long)pvVar1 + 0x28) == 0x7fffffffffffffff) {
            builtin_strncpy(e.expire,"unlimited",10);
LAB_0010d3c9:
            CVar4 = (*(data->set).hsts_write)(data,&e,&i,(data->set).hsts_write_userp);
            unaff_R12 = (Curl_llist_element *)(ulong)(CVar4 != CURLSTS_OK);
            CVar2 = CURLE_OK;
            if (CVar4 == CURLSTS_FAIL) {
              CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
            }
          }
          else {
            CVar2 = Curl_gmtime(*(long *)((long)pvVar1 + 0x28),&local_90);
            if (CVar2 == CURLE_OK) {
              curl_msnprintf(e.expire,0x12,"%d%02d%02d %02d:%02d:%02d",
                             (ulong)(local_90.tm_year + 0x76c),(ulong)(local_90.tm_mon + 1),
                             (ulong)(uint)local_90.tm_mday,(ulong)(uint)local_90.tm_hour,
                             (ulong)(uint)local_90.tm_min,(ulong)(uint)local_90.tm_sec);
              goto LAB_0010d3c9;
            }
          }
        } while (((CVar2 == CURLE_OK) && (((ulong)unaff_R12 & 1) == 0)) &&
                (i.index = i.index + 1, pCVar6 != (Curl_llist_element *)0x0));
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_hsts_save(struct Curl_easy *data, struct hsts *h,
                        const char *file)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!h)
    /* no cache activated */
    return CURLE_OK;

  /* if no new name is given, use the one we stored from the load */
  if(!file && h->filename)
    file = h->filename;

  if((h->flags & CURLHSTS_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length file name */
    goto skipsave;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      result = hsts_out(sts, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
skipsave:
  if(data->set.hsts_write) {
    /* if there's a write callback */
    struct curl_index i; /* count */
    i.total = h->list.size;
    i.index = 0;
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      bool stop;
      n = e->next;
      result = hsts_push(data, &i, sts, &stop);
      if(result || stop)
        break;
      i.index++;
    }
  }
  return result;
}